

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::ReadMat1_Ascii
          (COBImporter *this,Scene *out,LineSplitter *splitter,ChunkInfo *nfo)

{
  LineSplitter *pLVar1;
  bool bVar2;
  uint uVar3;
  Logger *pLVar4;
  basic_formatter *pbVar5;
  char *pcVar6;
  ai_real aVar7;
  char *local_968;
  char *tokens [10];
  string local_7a0;
  char *local_780;
  char *rgb;
  string local_600;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  string local_468;
  string local_448 [39];
  allocator local_421;
  undefined1 local_420 [8];
  string shader;
  string local_288;
  reference local_268;
  Material *mat;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_48;
  ChunkInfo *local_28;
  ChunkInfo *nfo_local;
  LineSplitter *splitter_local;
  Scene *out_local;
  COBImporter *this_local;
  
  local_28 = nfo;
  nfo_local = (ChunkInfo *)splitter;
  splitter_local = (LineSplitter *)out;
  out_local = (Scene *)this;
  if (nfo->version < 9) {
    LineSplitter::operator++(splitter);
    bVar2 = LineSplitter::match_start((LineSplitter *)nfo_local,"mat# ");
    if (bVar2) {
      pLVar1 = splitter_local + 1;
      COB::Material::Material((Material *)&mat);
      std::vector<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>::push_back
                ((vector<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_> *)
                 &(pLVar1->mCur).field_2,(Material *)&mat);
      COB::Material::~Material((Material *)&mat);
      local_268 = std::vector<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>::back
                            ((vector<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                              *)&splitter_local[1].mCur.field_2);
      uVar3 = local_28->parent_id;
      (local_268->super_ChunkInfo).id = local_28->id;
      (local_268->super_ChunkInfo).parent_id = uVar3;
      uVar3 = local_28->size;
      (local_268->super_ChunkInfo).version = local_28->version;
      (local_268->super_ChunkInfo).size = uVar3;
      pcVar6 = LineSplitter::operator[]((LineSplitter *)nfo_local,1);
      uVar3 = strtoul10(pcVar6,(char **)0x0);
      local_268->matnum = uVar3;
      LineSplitter::operator++((LineSplitter *)nfo_local);
      bVar2 = LineSplitter::match_start((LineSplitter *)nfo_local,"shader: ");
      if (bVar2) {
        pcVar6 = LineSplitter::operator[]((LineSplitter *)nfo_local,1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_420,pcVar6,&local_421);
        std::allocator<char>::~allocator((allocator<char> *)&local_421);
        std::__cxx11::string::find_first_of(local_420,0xc78c43);
        std::__cxx11::string::substr((ulong)local_448,(ulong)local_420);
        std::__cxx11::string::operator=((string *)local_420,local_448);
        std::__cxx11::string::~string(local_448);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_420,"metal");
        if (bVar2) {
          local_268->shader = METAL;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_420,"phong");
          if (bVar2) {
            local_268->shader = PHONG;
          }
          else {
            bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_420,"flat");
            if (bVar2) {
              pLVar4 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[44]>
                        (&local_5e0,(char (*) [44])"Unknown value for `shader` in `Mat1` chunk ");
              pbVar5 = (basic_formatter *)
                       Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                       ::operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                    *)&local_5e0,&local_28->id);
              Formatter::basic_formatter::operator_cast_to_string(&local_468,pbVar5);
              Logger::warn(pLVar4,&local_468);
              std::__cxx11::string::~string((string *)&local_468);
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              ~basic_formatter(&local_5e0);
            }
          }
        }
        LineSplitter::operator++((LineSplitter *)nfo_local);
        bVar2 = LineSplitter::match_start((LineSplitter *)nfo_local,"rgb ");
        if (!bVar2) {
          pLVar4 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[37]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&rgb,
                     (char (*) [37])"Expected `rgb` line in `Mat1` chunk ");
          pbVar5 = (basic_formatter *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             &rgb,&local_28->id);
          Formatter::basic_formatter::operator_cast_to_string(&local_600,pbVar5);
          Logger::warn(pLVar4,&local_600);
          std::__cxx11::string::~string((string *)&local_600);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &rgb);
        }
        local_780 = LineSplitter::operator[]((LineSplitter *)nfo_local,1);
        ReadFloat3Tuple_Ascii<aiColor3D>(this,&local_268->rgb,&local_780);
        LineSplitter::operator++((LineSplitter *)nfo_local);
        bVar2 = LineSplitter::match_start((LineSplitter *)nfo_local,"alpha ");
        if (!bVar2) {
          pLVar4 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[39]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (tokens + 9),(char (*) [39])"Expected `alpha` line in `Mat1` chunk ");
          pbVar5 = (basic_formatter *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             (tokens + 9),&local_28->id);
          Formatter::basic_formatter::operator_cast_to_string(&local_7a0,pbVar5);
          Logger::warn(pLVar4,&local_7a0);
          std::__cxx11::string::~string((string *)&local_7a0);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (tokens + 9));
        }
        LineSplitter::get_tokens<10ul>((LineSplitter *)nfo_local,(char *(*) [10])&local_968);
        aVar7 = fast_atof(tokens[0]);
        local_268->alpha = aVar7;
        aVar7 = fast_atof(tokens[2]);
        local_268->ka = aVar7;
        aVar7 = fast_atof(tokens[4]);
        local_268->ks = aVar7;
        aVar7 = fast_atof(tokens[6]);
        local_268->exp = aVar7;
        aVar7 = fast_atof(tokens[8]);
        local_268->ior = aVar7;
        std::__cxx11::string::~string((string *)local_420);
      }
      else {
        pLVar4 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[38]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (shader.field_2._M_local_buf + 8),
                   (char (*) [38])"Expected `mat#` line in `Mat1` chunk ");
        pbVar5 = (basic_formatter *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                           (shader.field_2._M_local_buf + 8),&local_28->id);
        Formatter::basic_formatter::operator_cast_to_string(&local_288,pbVar5);
        Logger::warn(pLVar4,&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&shader.field_2 + 8));
      }
    }
    else {
      pLVar4 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[38]>(&local_1c0,(char (*) [38])"Expected `mat#` line in `Mat1` chunk ");
      pbVar5 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_1c0,&local_28->id);
      Formatter::basic_formatter::operator_cast_to_string(&local_48,pbVar5);
      Logger::warn(pLVar4,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_1c0);
    }
  }
  else {
    UnsupportedChunk_Ascii(this,splitter,nfo,"Mat1");
  }
  return;
}

Assistant:

void COBImporter::ReadMat1_Ascii(Scene& out, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 8) {
        return UnsupportedChunk_Ascii(splitter,nfo,"Mat1");
    }

    ++splitter;
    if (!splitter.match_start("mat# ")) {
        ASSIMP_LOG_WARN_F( "Expected `mat#` line in `Mat1` chunk ", nfo.id );
        return;
    }

    out.materials.push_back(Material());
    Material& mat = out.materials.back();
    mat = nfo;

    mat.matnum = strtoul10(splitter[1]);
    ++splitter;

    if (!splitter.match_start("shader: ")) {
        ASSIMP_LOG_WARN_F( "Expected `mat#` line in `Mat1` chunk ", nfo.id);
        return;
    }
    std::string shader = std::string(splitter[1]);
    shader = shader.substr(0,shader.find_first_of(" \t"));

    if (shader == "metal") {
        mat.shader = Material::METAL;
    }
    else if (shader == "phong") {
        mat.shader = Material::PHONG;
    }
    else if (shader != "flat") {
        ASSIMP_LOG_WARN_F( "Unknown value for `shader` in `Mat1` chunk ", nfo.id );
    }

    ++splitter;
    if (!splitter.match_start("rgb ")) {
        ASSIMP_LOG_WARN_F( "Expected `rgb` line in `Mat1` chunk ", nfo.id);
    }

    const char* rgb = splitter[1];
    ReadFloat3Tuple_Ascii(mat.rgb,&rgb);

    ++splitter;
    if (!splitter.match_start("alpha ")) {
        ASSIMP_LOG_WARN_F( "Expected `alpha` line in `Mat1` chunk ", nfo.id);
    }

    const char* tokens[10];
    splitter.get_tokens(tokens);

    mat.alpha   = fast_atof( tokens[1] );
    mat.ka      = fast_atof( tokens[3] );
    mat.ks      = fast_atof( tokens[5] );
    mat.exp     = fast_atof( tokens[7] );
    mat.ior     = fast_atof( tokens[9] );
}